

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_word.cpp
# Opt level: O1

wstring * __thiscall BmsWord::ToWString_abi_cxx11_(wstring *__return_storage_ptr__,BmsWord *this)

{
  string s;
  allocator local_31;
  undefined1 *local_30;
  long local_28;
  undefined1 local_20 [16];
  
  CheckValid(this);
  std::__cxx11::string::string
            ((string *)&local_30,
             *(char **)((anonymous_namespace)::WORD_TABLE + (long)this->value_ * 8),&local_31);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::wstring::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((wstring *)__return_storage_ptr__,local_30,local_30 + local_28);
  if (local_30 != local_20) {
    operator_delete(local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring
BmsWord::ToWString(void) const
{
	std::string s = ToString();
	return std::wstring(s.begin(), s.end());
}